

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O3

ion_err_t oafdict_close_dictionary(ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  
  iVar1 = oafh_close((ion_file_hashmap_t *)dictionary->instance);
  dictionary->instance = (ion_dictionary_parent_t *)0x0;
  return (iVar1 != '\0') << 2;
}

Assistant:

ion_err_t
oafdict_close_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_file_hashmap_t	*hash_map;
	ion_err_t			err;

	hash_map	= (ion_file_hashmap_t *) dictionary->instance;
	err			= oafh_close(hash_map);

	/* The following line creates an allocation error. Will not including it create a memory leak? */
/*	free(dictionary->instance); */

	dictionary->instance = NULL;

	if (err_ok != err) {
		return err_dictionary_destruction_error;
	}

	return err_ok;
}